

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

void __thiscall ON_Buffer::EmergencyDestroy(ON_Buffer *this)

{
  this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
  this->m_error_handler = (ON_Buffer_ErrorHandler)0x0;
  this->m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
  this->m_last_segment = (ON_BUFFER_SEGMENT *)0x0;
  this->m_buffer_size = 0;
  this->m_current_position = 0;
  this->m_last_error = 0;
  return;
}

Assistant:

void ON_Buffer::EmergencyDestroy()
{
  m_buffer_size = 0;
  m_current_position = 0;
  m_first_segment = 0;
  m_last_segment = 0;
  m_current_segment = 0;
  m_error_handler = 0;
  m_last_error = 0;
}